

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::LoopEntryPointInfo::OnCleanup(LoopEntryPointInfo *this,bool isShutdown)

{
  bool bVar1;
  LoopHeader *pLVar2;
  FunctionBody *this_00;
  ScriptContext *scriptContext;
  bool isShutdown_local;
  LoopEntryPointInfo *this_local;
  
  bVar1 = EntryPointInfo::IsCodeGenDone(&this->super_EntryPointInfo);
  if ((bVar1) && (bVar1 = EntryPointInfo::GetIsTJMode(&this->super_EntryPointInfo), !bVar1)) {
    pLVar2 = Memory::WriteBarrierPtr<Js::LoopHeader>::operator->(&this->loopHeader);
    this_00 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&pLVar2->functionBody);
    scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    EntryPointInfo::CleanupNativeCode(&this->super_EntryPointInfo,scriptContext);
  }
  return;
}

Assistant:

void LoopEntryPointInfo::OnCleanup(bool isShutdown)
    {
#ifdef ASMJS_PLAT
        if (this->IsCodeGenDone() && !this->GetIsTJMode())
#else
        if (this->IsCodeGenDone())
#endif
        {
            JS_ETW(EtwTrace::LogLoopBodyUnloadEvent(this->loopHeader->functionBody, this,
                this->loopHeader->functionBody->GetLoopNumber(this->loopHeader)));

#if ENABLE_NATIVE_CODEGEN
            this->CleanupNativeCode(this->loopHeader->functionBody->GetScriptContext());
#endif
        }
    }